

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikcp.c
# Opt level: O2

int ikcp_setmtu(ikcpcb *kcp,int mtu)

{
  int iVar1;
  char *pcVar2;
  
  if (mtu < 0x32) {
    return -1;
  }
  pcVar2 = (char *)ikcp_malloc((ulong)(mtu * 3 + 0x48));
  if (pcVar2 == (char *)0x0) {
    iVar1 = -2;
  }
  else {
    kcp->mtu = mtu;
    kcp->mss = mtu - 0x18;
    ikcp_free(kcp->buffer);
    kcp->buffer = pcVar2;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int ikcp_setmtu(ikcpcb *kcp, int mtu)
{
	char *buffer;
	if (mtu < 50 || mtu < (int)IKCP_OVERHEAD) 
		return -1;
	buffer = (char*)ikcp_malloc((mtu + IKCP_OVERHEAD) * 3);
	if (buffer == NULL) 
		return -2;
	kcp->mtu = mtu;
	kcp->mss = kcp->mtu - IKCP_OVERHEAD;
	ikcp_free(kcp->buffer);
	kcp->buffer = buffer;
	return 0;
}